

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O0

BasisCodec __thiscall
ktx::OptionsEncodeBasis<true>::validateBasisCodec
          (OptionsEncodeBasis<true> *this,OptionValue *codecOpt)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>
  __l;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer pvVar5;
  OptionValue *in_RSI;
  const_iterator it;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>_>
  *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb8;
  hasher *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>_>
  *in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
  *in_stack_fffffffffffffee0;
  allocator_type *in_stack_fffffffffffffef0;
  OptionValue *in_stack_ffffffffffffff00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>,_true>
  local_f0;
  string local_e8 [32];
  string local_c8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>,_true>
  local_a8;
  undefined1 local_9b [35];
  OptionValue local_78;
  undefined1 local_50 [40];
  OptionValue local_28;
  
  local_28.m_value.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI;
  if (validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_)
    ;
    if (iVar2 != 0) {
      local_9b._27_8_ = local_9b + 0x23;
      local_9b._23_4_ = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
      ::pair<const_char_(&)[9],_ktx::BasisCodec,_true>
                (in_stack_fffffffffffffee0,(char (*) [9])in_stack_fffffffffffffed8,
                 (BasisCodec *)in_stack_fffffffffffffed0);
      local_9b._27_8_ = local_50;
      local_9b._3_4_ = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
      ::pair<const_char_(&)[6],_ktx::BasisCodec,_true>
                (in_stack_fffffffffffffee0,(char (*) [6])in_stack_fffffffffffffed8,
                 (BasisCodec *)in_stack_fffffffffffffed0);
      local_28.m_long_names = (OptionNames *)(local_9b + 0x23);
      local_28.m_value.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x2;
      in_stack_fffffffffffffea8 =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>_>
            *)local_9b;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>
                   *)0x2653e9);
      __l._M_len = (size_type)in_stack_fffffffffffffee0;
      __l._M_array = in_stack_fffffffffffffed8;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>_>
      ::unordered_map(in_stack_fffffffffffffed0,__l,in_stack_fffffffffffffec8,
                      in_stack_fffffffffffffec0,(key_equal *)in_stack_fffffffffffffeb8,
                      in_stack_fffffffffffffef0);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>
                    *)0x265433);
      in_stack_ffffffffffffff00 = &local_28;
      do {
        in_stack_ffffffffffffff00 = in_stack_ffffffffffffff00 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>
                 *)0x26545c);
      } while (in_stack_ffffffffffffff00 != (OptionValue *)(local_9b + 0x23));
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>_>
                   ::~unordered_map,
                   &validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&validateBasisCodec(cxxopts::OptionValue_const&)::codecs_abi_cxx11_);
    }
  }
  sVar3 = cxxopts::OptionValue::count
                    ((OptionValue *)
                     local_28.m_value.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
  if (sVar3 == 0) {
    local_28._36_4_ = NONE;
  }
  else {
    pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_ffffffffffffff00);
    std::__cxx11::string::string(local_e8,(string *)pbVar4);
    to_lower_copy(in_stack_fffffffffffffeb8);
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>_>
         ::find(in_stack_fffffffffffffea8,(key_type *)0x2654f4);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    local_f0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>_>_>
         ::end(in_stack_fffffffffffffea8);
    bVar1 = std::__detail::operator!=(&local_a8,&local_f0);
    if (bVar1) {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx::BasisCodec>,_false,_true>
                             *)0x265558);
      local_28._36_4_ = pvVar5->second;
    }
    else {
      local_28._36_4_ = INVALID;
    }
  }
  return local_28._36_4_;
}

Assistant:

BasisCodec validateBasisCodec(const cxxopts::OptionValue& codecOpt) const {
        static const std::unordered_map<std::string, BasisCodec> codecs = {
            { "basis-lz", BasisCodec::BasisLZ },
            { "uastc", BasisCodec::UASTC }
        };
        if (codecOpt.count()) {
            auto it = codecs.find(to_lower_copy(codecOpt.as<std::string>()));
            if (it != codecs.end()) {
                return it->second;
            } else {
                return BasisCodec::INVALID;
            }
        } else {
            return BasisCodec::NONE;
        }
    }